

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minefield.cpp
# Opt level: O1

bool __thiscall Minefield::isGameLost(Minefield *this)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  
  if ((this->opened_mine == false) &&
     (this->given_mine_count < this->given_y_dimension * this->given_x_dimension - this->open_cnt))
  {
    bVar1 = false;
  }
  else {
    bVar1 = 0 < this->given_x_dimension;
    if (0 < this->given_x_dimension) {
      lVar3 = 0;
      do {
        bVar2 = 0 < this->given_y_dimension;
        if (0 < this->given_y_dimension) {
          uVar4 = 0;
          do {
            if (((*(ulong *)(*(long *)&(this->mines).
                                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar3].
                                       super__Bvector_base<std::allocator<bool>_>._M_impl +
                            (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) != 0) &&
               (checkPos(this,(int)lVar3,(int)uVar4),
               (*(ulong *)(*(long *)&(this->opened).
                                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar3].
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f)
               & 1) != 0)) {
              if (bVar2) {
                return bVar1;
              }
              break;
            }
            uVar4 = uVar4 + 1;
            bVar2 = (long)uVar4 < (long)this->given_y_dimension;
          } while ((long)uVar4 < (long)this->given_y_dimension);
        }
        lVar3 = lVar3 + 1;
        bVar1 = lVar3 < this->given_x_dimension;
      } while (lVar3 < this->given_x_dimension);
    }
  }
  return bVar1;
}

Assistant:

bool Minefield::isGameLost() {
    if (! isGameEnded()) {
        return false;
    }

    // there is a field w/ a mine that has been opened
    for (int x = 0; x < getXDimension(); x++) {
        for (int y = 0; y < getYDimension(); y++) {
            if (mines[x][y] && isOpen(x, y)) {
                return true;
            }
        }
    }
    return false;
}